

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

void Fra_AddClausesSuper(Fra_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  lit *begin;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_3c;
  int i;
  int RetValue;
  int nLits;
  int *pLits;
  Aig_Obj_t *pFanin;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pNode_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0x85,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Aig_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0x86,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Vec_PtrSize(vSuper);
  begin = (lit *)malloc((long)(iVar1 + 1) << 2);
  for (local_3c = 0; iVar2 = Vec_PtrSize(vSuper), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_3c);
    pAVar6 = Aig_Regular(pAVar5);
    iVar2 = Fra_ObjSatNum(pAVar6);
    iVar3 = Aig_IsComplement(pAVar5);
    lVar4 = toLitCond(iVar2,iVar3);
    *begin = lVar4;
    iVar2 = Fra_ObjSatNum(pNode);
    lVar4 = toLitCond(iVar2,1);
    begin[1] = lVar4;
    iVar2 = sat_solver_addclause(p->pSat,begin,begin + 2);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                    ,0x91,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(vSuper), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_3c);
    pAVar6 = Aig_Regular(pAVar5);
    iVar2 = Fra_ObjSatNum(pAVar6);
    iVar3 = Aig_IsComplement(pAVar5);
    lVar4 = toLitCond(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    begin[local_3c] = lVar4;
  }
  iVar2 = Fra_ObjSatNum(pNode);
  lVar4 = toLitCond(iVar2,0);
  begin[iVar1] = lVar4;
  iVar1 = sat_solver_addclause(p->pSat,begin,begin + (iVar1 + 1));
  if (iVar1 != 0) {
    if (begin != (lit *)0x0) {
      free(begin);
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                ,0x98,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Fra_AddClausesSuper( Fra_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Fra_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Fra_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}